

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packColumns(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  Dring *pDVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  pCVar1 = &(this->u).col;
  pDVar8 = (this->u).col.list.next;
  piVar4 = (this->u).col.max;
  if ((Col *)pDVar8 == pCVar1) {
    uVar9 = 0;
  }
  else {
    piVar5 = (this->u).col.idx;
    piVar6 = (this->u).col.len;
    piVar7 = (this->u).col.start;
    uVar10 = 0;
    do {
      iVar2 = pDVar8->idx;
      if (piVar7[iVar2] != (int)uVar10) goto LAB_002a6259;
      uVar9 = (int)uVar10 + piVar6[iVar2];
      uVar10 = (ulong)uVar9;
      piVar4[iVar2] = piVar6[iVar2];
      pDVar8 = pDVar8->next;
    } while ((Col *)pDVar8 != pCVar1);
  }
LAB_002a629c:
  (this->u).col.used = uVar9;
  piVar4[this->thedim] = 0;
  return;
LAB_002a6259:
  do {
    iVar2 = pDVar8->idx;
    iVar3 = piVar7[iVar2];
    lVar11 = (long)iVar3;
    piVar7[iVar2] = (int)uVar10;
    piVar4[iVar2] = piVar6[iVar2];
    iVar2 = piVar6[iVar2];
    if (0 < iVar2) {
      uVar10 = (ulong)(int)uVar10;
      do {
        piVar5[uVar10] = piVar5[lVar11];
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar2 + iVar3);
    }
    uVar9 = (uint)uVar10;
    pDVar8 = pDVar8->next;
  } while ((Col *)pDVar8 != pCVar1);
  goto LAB_002a629c;
}

Assistant:

void CLUFactor<R>::packColumns()
{
   int n, i, j, l_col;
   Dring* ring, *list;

   int* l_cidx = u.col.idx;
   int* l_clen = u.col.len;
   int* l_cmax = u.col.max;
   int* l_cbeg = u.col.start;

   n = 0;
   list = &(u.col.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_col = ring->idx;

      if(l_cbeg[l_col] != n)
      {
         do
         {
            l_col = ring->idx;
            i = l_cbeg[l_col];
            l_cbeg[l_col] = n;
            l_cmax[l_col] = l_clen[l_col];
            j = i + l_clen[l_col];

            for(; i < j; ++i)
               l_cidx[n++] = l_cidx[i];

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += l_clen[l_col];

      l_cmax[l_col] = l_clen[l_col];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}